

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KktChStep.cpp
# Opt level: O3

void __thiscall KktChStep::printAR(KktChStep *this)

{
  pointer piVar1;
  pointer piVar2;
  long lVar3;
  size_t sVar4;
  ulong uVar5;
  ulong uVar6;
  ostream *poVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  char *pcVar11;
  long lVar12;
  char buff [4];
  char local_34 [4];
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\n-----cost-----\n",0x10);
  if (0 < this->numCol) {
    lVar12 = 0;
    do {
      sprintf(local_34,"%2.1g ",
              (this->colCost).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[lVar12]);
      *(undefined8 *)(putchar + *(long *)(std::cout + -0x18)) = 5;
      sVar4 = strlen(local_34);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_34,sVar4);
      lVar12 = lVar12 + 1;
    } while (lVar12 < this->numCol);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18));
  std::ostream::put('\0');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"------AR-|-b-----\n",0x12);
  if (0 < this->RnumRow) {
    lVar12 = 0;
    do {
      if (0 < this->RnumCol) {
        iVar10 = 0;
        do {
          piVar1 = (this->ARstart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          piVar2 = (this->ARindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          uVar9 = piVar1[lVar12];
          uVar5 = (ulong)(int)uVar9;
          if (piVar2[uVar5] == iVar10) {
            uVar8 = piVar1[lVar12 + 1];
            uVar6 = (ulong)uVar9;
          }
          else {
            uVar8 = piVar1[lVar12 + 1];
            if ((int)uVar9 <= (int)uVar8) {
              uVar9 = uVar8;
            }
            uVar6 = uVar5;
            do {
              if ((long)(int)uVar9 == uVar6) goto LAB_00152540;
              uVar5 = uVar6 + 1;
              lVar3 = uVar6 + 1;
              uVar6 = uVar5;
            } while (piVar2[lVar3] != iVar10);
          }
          if ((int)uVar6 < (int)uVar8) {
            sprintf(local_34,"%2.1g ",
                    (this->ARvalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar5]);
            *(undefined8 *)(putchar + *(long *)(std::cout + -0x18)) = 5;
            sVar4 = strlen(local_34);
            pcVar11 = local_34;
          }
          else {
LAB_00152540:
            *(undefined8 *)(putchar + *(long *)(std::cout + -0x18)) = 5;
            sVar4 = 3;
            pcVar11 = "   ";
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar11,sVar4);
          iVar10 = iVar10 + 1;
        } while (iVar10 < this->RnumCol);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  |   ",6);
      *(undefined8 *)(putchar + *(long *)(std::cout + -0x18)) = 5;
      poVar7 = std::ostream::_M_insert<double>
                         ((this->RrowLower).super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start[lVar12]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," < < ",5);
      poVar7 = std::ostream::_M_insert<double>
                         ((this->RrowUpper).super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start[lVar12]);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      lVar12 = lVar12 + 1;
    } while (lVar12 < this->RnumRow);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18));
  std::ostream::put('\0');
  std::ostream::flush();
  return;
}

Assistant:

void KktChStep::printAR() {
	char buff [4];
	cout<<"\n-----cost-----\n";

	for (int i=0;i<numCol;i++) {
		sprintf(buff, "%2.1g ", colCost[i]);
		cout<<std::setw(5)<<buff; 
	}
	cout<<endl;
	cout<<"------AR-|-b-----\n";
	for (int i=0;i<RnumRow;i++) {
		for (int j=0;j<RnumCol;j++) {

			int ind = ARstart[i];
			while (ARindex[ind]!=j && ind<ARstart[i+1]) 
				ind++;
			//if a_ij is nonzero print
			if (ARindex[ind]==j && ind<ARstart[i+1])
			{	
				sprintf(buff, "%2.1g ", ARvalue[ind]);
				cout<<std::setw(5)<<buff; 
				}
			else cout<<std::setw(5)<<"   ";
			
		}
		
		cout<<"  |   "<<std::setw(5)<<RrowLower[i]<<" < < "<<RrowUpper[i]<<endl;
		
	}
	
	cout<<endl;
}